

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigDup.c
# Opt level: O3

void Saig_ManDupCones_rec
               (Aig_Man_t *p,Aig_Obj_t *pObj,Vec_Ptr_t *vLeaves,Vec_Ptr_t *vNodes,Vec_Ptr_t *vRoots)

{
  int iVar1;
  int iVar2;
  void **ppvVar3;
  uint uVar4;
  
  iVar1 = p->nTravIds;
  iVar2 = pObj->TravId;
  while( true ) {
    if (iVar2 == iVar1) {
      return;
    }
    pObj->TravId = iVar1;
    uVar4 = (uint)*(undefined8 *)&pObj->field_0x18;
    if (0xfffffffd < (uVar4 & 7) - 7) break;
    uVar4 = uVar4 & 7;
    if (uVar4 != 3) {
      if (uVar4 != 2) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/saig/saigDup.c"
                      ,0x21f,
                      "void Saig_ManDupCones_rec(Aig_Man_t *, Aig_Obj_t *, Vec_Ptr_t *, Vec_Ptr_t *, Vec_Ptr_t *)"
                     );
      }
      if ((pObj->field_0).CioId < p->nTruePis) {
        Vec_PtrPush(vLeaves,pObj);
        return;
      }
      uVar4 = ((pObj->field_0).CioId - p->nTruePis) + p->nTruePos;
      if (((int)uVar4 < 0) || (p->vCos->nSize <= (int)uVar4)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      pObj = (Aig_Obj_t *)p->vCos->pArray[uVar4];
      uVar4 = vRoots->nSize;
      if (uVar4 == vRoots->nCap) {
        if ((int)uVar4 < 0x10) {
          if (vRoots->pArray == (void **)0x0) {
            ppvVar3 = (void **)malloc(0x80);
          }
          else {
            ppvVar3 = (void **)realloc(vRoots->pArray,0x80);
          }
          vRoots->pArray = ppvVar3;
          vRoots->nCap = 0x10;
        }
        else {
          if (vRoots->pArray == (void **)0x0) {
            ppvVar3 = (void **)malloc((ulong)uVar4 << 4);
          }
          else {
            ppvVar3 = (void **)realloc(vRoots->pArray,(ulong)uVar4 << 4);
          }
          vRoots->pArray = ppvVar3;
          vRoots->nCap = uVar4 * 2;
        }
      }
      else {
        ppvVar3 = vRoots->pArray;
      }
      iVar1 = vRoots->nSize;
      vRoots->nSize = iVar1 + 1;
      goto LAB_006e2669;
    }
    pObj = (Aig_Obj_t *)((ulong)pObj->pFanin0 & 0xfffffffffffffffe);
    iVar2 = pObj->TravId;
  }
  Saig_ManDupCones_rec
            (p,(Aig_Obj_t *)((ulong)pObj->pFanin0 & 0xfffffffffffffffe),vLeaves,vNodes,vRoots);
  Saig_ManDupCones_rec
            (p,(Aig_Obj_t *)((ulong)pObj->pFanin1 & 0xfffffffffffffffe),vLeaves,vNodes,vRoots);
  uVar4 = vNodes->nSize;
  if (uVar4 == vNodes->nCap) {
    if ((int)uVar4 < 0x10) {
      if (vNodes->pArray == (void **)0x0) {
        ppvVar3 = (void **)malloc(0x80);
      }
      else {
        ppvVar3 = (void **)realloc(vNodes->pArray,0x80);
      }
      vNodes->pArray = ppvVar3;
      vNodes->nCap = 0x10;
    }
    else {
      if (vNodes->pArray == (void **)0x0) {
        ppvVar3 = (void **)malloc((ulong)uVar4 << 4);
      }
      else {
        ppvVar3 = (void **)realloc(vNodes->pArray,(ulong)uVar4 << 4);
      }
      vNodes->pArray = ppvVar3;
      vNodes->nCap = uVar4 * 2;
    }
  }
  else {
    ppvVar3 = vNodes->pArray;
  }
  iVar1 = vNodes->nSize;
  vNodes->nSize = iVar1 + 1;
LAB_006e2669:
  ppvVar3[iVar1] = pObj;
  return;
}

Assistant:

void Saig_ManDupCones_rec( Aig_Man_t * p, Aig_Obj_t * pObj, Vec_Ptr_t * vLeaves, Vec_Ptr_t * vNodes, Vec_Ptr_t * vRoots )
{
    if ( Aig_ObjIsTravIdCurrent(p, pObj) )
        return;
    Aig_ObjSetTravIdCurrent(p, pObj);
    if ( Aig_ObjIsNode(pObj) )
    {
        Saig_ManDupCones_rec( p, Aig_ObjFanin0(pObj), vLeaves, vNodes, vRoots );
        Saig_ManDupCones_rec( p, Aig_ObjFanin1(pObj), vLeaves, vNodes, vRoots );
        Vec_PtrPush( vNodes, pObj );
    }
    else if ( Aig_ObjIsCo(pObj) )
        Saig_ManDupCones_rec( p, Aig_ObjFanin0(pObj), vLeaves, vNodes, vRoots );
    else if ( Saig_ObjIsLo(p, pObj) )
        Vec_PtrPush( vRoots, Saig_ObjLoToLi(p, pObj) );
    else if ( Saig_ObjIsPi(p, pObj) )
        Vec_PtrPush( vLeaves, pObj );
    else assert( 0 );
}